

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O2

void __thiscall HighsMipSolverData::performRestart(HighsMipSolverData *this)

{
  HighsPostsolveStack *postsolveStack;
  undefined8 uVar1;
  undefined8 uVar2;
  int iVar3;
  int iVar4;
  HighsModelStatus HVar5;
  pointer pHVar6;
  pointer piVar7;
  pointer pdVar8;
  _Head_base<0UL,_HighsMipSolverData_*,_false> this_00;
  HighsLp *pHVar9;
  HighsMipSolver *pHVar10;
  uint uVar11;
  ulong uVar12;
  int numCuts;
  HighsInt presolve_reduction_limit;
  ulong uVar13;
  double dVar14;
  undefined1 auVar15 [16];
  double to_lower_bound;
  double dVar16;
  _Vector_base<HighsVarType,_std::allocator<HighsVarType>_> local_1d8;
  _Vector_base<double,_std::allocator<double>_> local_1b8;
  HighsBasis root_basis;
  HighsPseudocostInitialization pscostinit;
  
  HighsBasis::HighsBasis(&root_basis);
  postsolveStack = &this->postSolveStack;
  HighsPseudocostInitialization::HighsPseudocostInitialization
            (&pscostinit,&this->pseudocost,
             (this->mipsolver->options_mip_->super_HighsOptionsStruct).mip_pscost_minreliable,
             postsolveStack);
  pHVar10 = this->mipsolver;
  pHVar10->pscostinit = &pscostinit;
  this->numRestarts = this->numRestarts + 1;
  uVar1 = this->num_nodes;
  uVar2 = this->num_leaves;
  auVar15._8_4_ = (int)uVar1;
  auVar15._0_8_ = uVar2;
  auVar15._12_4_ = (int)((ulong)uVar1 >> 0x20);
  this->num_leaves_before_run = uVar2;
  this->num_nodes_before_run = auVar15._8_8_;
  this->total_lp_iterations_before_run = this->total_lp_iterations;
  this->heuristic_lp_iterations_before_run = this->heuristic_lp_iterations;
  this->sepa_lp_iterations_before_run = this->sepa_lp_iterations;
  this->sb_lp_iterations_before_run = this->sb_lp_iterations;
  iVar3 = (this->lp).lpsolver.model_.lp_.num_row_;
  iVar4 = pHVar10->model_->num_row_;
  numCuts = iVar3 - iVar4;
  if (numCuts != 0 && iVar4 <= iVar3) {
    presolve::HighsPostsolveStack::appendCutsToModel(postsolveStack,numCuts);
  }
  local_1d8._M_impl.super__Vector_impl_data._M_start =
       (this->presolvedModel).integrality_.
       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_1d8._M_impl.super__Vector_impl_data._M_finish =
       (this->presolvedModel).integrality_.
       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_1d8._M_impl.super__Vector_impl_data._M_end_of_storage =
       (this->presolvedModel).integrality_.
       super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (this->presolvedModel).integrality_.
  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->presolvedModel).integrality_.
  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->presolvedModel).integrality_.
  super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  dVar16 = (this->presolvedModel).offset_;
  HighsLp::operator=(&this->presolvedModel,&(this->lp).lpsolver.model_.lp_);
  (this->presolvedModel).offset_ = dVar16;
  std::vector<HighsVarType,_std::allocator<HighsVarType>_>::_M_move_assign
            (&(this->presolvedModel).integrality_,&local_1d8);
  if ((this->firstrootbasis).valid == false) {
    pHVar9 = this->mipsolver->model_;
  }
  else {
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&root_basis.col_status,(long)(this->postSolveStack).origNumCol);
    local_1b8._M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT71(local_1b8._M_impl.super__Vector_impl_data._M_start._1_7_,1);
    std::vector<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>::resize
              (&root_basis.row_status,(long)(this->postSolveStack).origNumRow,
               (value_type *)&local_1b8);
    root_basis.valid = true;
    root_basis.useful = true;
    pHVar10 = this->mipsolver;
    pHVar9 = pHVar10->model_;
    pHVar6 = (this->firstrootbasis).col_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    piVar7 = (this->postSolveStack).origColIndex.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0;
    uVar12 = (ulong)(uint)pHVar9->num_col_;
    if (pHVar9->num_col_ < 1) {
      uVar12 = uVar13;
    }
    for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
      root_basis.col_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start[piVar7[uVar13]] = pHVar6[uVar13];
    }
    pHVar6 = (this->firstrootbasis).row_status.
             super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar11 = *(int *)&(this->firstrootbasis).row_status.
                      super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (int)pHVar6;
    piVar7 = (this->postSolveStack).origRowIndex.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar13 = 0;
    uVar12 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      uVar12 = uVar13;
    }
    for (; uVar12 != uVar13; uVar13 = uVar13 + 1) {
      root_basis.row_status.super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>.
      _M_impl.super__Vector_impl_data._M_start[piVar7[uVar13]] = pHVar6[uVar13];
    }
    pHVar10->rootbasis = &root_basis;
  }
  dVar16 = pHVar9->offset_;
  this->upper_limit = this->upper_limit + dVar16;
  this->optimality_limit = this->optimality_limit + dVar16;
  this->lower_bound = dVar16 + this->lower_bound;
  this->upper_bound = dVar16 + this->upper_bound;
  pdVar8 = (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar8) {
    (this->incumbent).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar8;
  }
  (this->pruned_treeweight).hi = 0.0;
  (this->pruned_treeweight).lo = 0.0;
  HighsNodeQueue::clear(&this->nodequeue);
  std::__shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>::reset
            (&(this->globalOrbits).
              super___shared_ptr<const_StabilizerOrbits,_(__gnu_cxx::_Lock_policy)2>);
  iVar3 = (this->mipsolver->options_mip_->super_HighsOptionsStruct).restart_presolve_reduction_limit
  ;
  presolve_reduction_limit = -1;
  if (-1 < iVar3) {
    presolve_reduction_limit =
         (int)((ulong)((long)(this->postSolveStack).reductions.
                             super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->postSolveStack).reductions.
                            super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
                            ._M_impl.super__Vector_impl_data._M_start) >> 4) + iVar3;
  }
  runPresolve(this,presolve_reduction_limit);
  pHVar10 = this->mipsolver;
  HVar5 = pHVar10->modelstatus_;
  if (HVar5 == kMin) {
    runSetup(this);
    presolve::HighsPostsolveStack::removeCutsFromModel(postsolveStack,numCuts);
    pHVar10 = this->mipsolver;
    if (pHVar10->rootbasis == &root_basis) {
      pHVar10->rootbasis = (HighsBasis *)0x0;
    }
    pHVar10->pscostinit = (HighsPseudocostInitialization *)0x0;
  }
  else {
    dVar16 = pHVar10->model_->offset_;
    this->upper_limit = this->upper_limit - dVar16;
    this->optimality_limit = this->optimality_limit - dVar16;
    if (HVar5 == kOptimal) {
      this_00._M_head_impl =
           (pHVar10->mipdata_)._M_t.
           super___uniq_ptr_impl<HighsMipSolverData,_std::default_delete<HighsMipSolverData>_>._M_t.
           super__Tuple_impl<0UL,_HighsMipSolverData_*,_std::default_delete<HighsMipSolverData>_>.
           super__Head_base<0UL,_HighsMipSolverData_*,_false>._M_head_impl;
      (this_00._M_head_impl)->upper_bound = 0.0;
      local_1b8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_1b8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_1b8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      transformNewIntegerFeasibleSolution
                (this_00._M_head_impl,(vector<double,_std::allocator<double>_> *)&local_1b8,true);
      std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_1b8);
      pHVar10 = this->mipsolver;
      dVar16 = pHVar10->model_->offset_;
      to_lower_bound = this->upper_bound;
    }
    else {
      to_lower_bound = this->upper_bound - dVar16;
      this->upper_bound = to_lower_bound;
    }
    dVar14 = this->lower_bound;
    this->lower_bound = to_lower_bound;
    if (pHVar10->submip == false) {
      dVar14 = dVar14 - dVar16;
      if ((to_lower_bound != dVar14) || (NAN(to_lower_bound) || NAN(dVar14))) {
        updatePrimalDualIntegral
                  (this,dVar14,to_lower_bound,to_lower_bound,to_lower_bound,false,false);
        pHVar10 = this->mipsolver;
      }
    }
    if ((pHVar10->solution_objective_ < INFINITY) && (pHVar10->modelstatus_ == kInfeasible)) {
      pHVar10->modelstatus_ = kOptimal;
    }
  }
  std::_Vector_base<HighsVarType,_std::allocator<HighsVarType>_>::~_Vector_base(&local_1d8);
  HighsPseudocostInitialization::~HighsPseudocostInitialization(&pscostinit);
  HighsBasis::~HighsBasis(&root_basis);
  return;
}

Assistant:

void HighsMipSolverData::performRestart() {
  HighsBasis root_basis;
  HighsPseudocostInitialization pscostinit(
      pseudocost, mipsolver.options_mip_->mip_pscost_minreliable,
      postSolveStack);

  mipsolver.pscostinit = &pscostinit;
  ++numRestarts;
  num_leaves_before_run = num_leaves;
  num_nodes_before_run = num_nodes;
  num_nodes_before_run = num_nodes;
  total_lp_iterations_before_run = total_lp_iterations;
  heuristic_lp_iterations_before_run = heuristic_lp_iterations;
  sepa_lp_iterations_before_run = sepa_lp_iterations;
  sb_lp_iterations_before_run = sb_lp_iterations;
  HighsInt numLpRows = lp.getLp().num_row_;
  HighsInt numModelRows = mipsolver.numRow();
  HighsInt numCuts = numLpRows - numModelRows;
  if (numCuts > 0) postSolveStack.appendCutsToModel(numCuts);
  auto integrality = std::move(presolvedModel.integrality_);
  double offset = presolvedModel.offset_;
  presolvedModel = lp.getLp();
  presolvedModel.offset_ = offset;
  presolvedModel.integrality_ = std::move(integrality);

  const HighsBasis& basis = firstrootbasis;
  if (basis.valid) {
    // if we have a basis after solving the root LP, we expand it to the
    // original space so that it can be used for constructing a starting basis
    // for the presolved model after the restart
    root_basis.col_status.resize(postSolveStack.getOrigNumCol());
    root_basis.row_status.resize(postSolveStack.getOrigNumRow(),
                                 HighsBasisStatus::kBasic);
    root_basis.valid = true;
    root_basis.useful = true;

    for (HighsInt i = 0; i < mipsolver.model_->num_col_; ++i)
      root_basis.col_status[postSolveStack.getOrigColIndex(i)] =
          basis.col_status[i];

    HighsInt numRow = basis.row_status.size();
    for (HighsInt i = 0; i < numRow; ++i)
      root_basis.row_status[postSolveStack.getOrigRowIndex(i)] =
          basis.row_status[i];

    mipsolver.rootbasis = &root_basis;
  }

  // Transform the reference of the objective limit and lower/upper
  // bounds to the original model, since offset will generally change
  // in presolve. Bound changes are transitory, so no real gap change,
  // and no update to P-D integral is necessary
  upper_limit += mipsolver.model_->offset_;
  optimality_limit += mipsolver.model_->offset_;

  upper_bound += mipsolver.model_->offset_;
  lower_bound += mipsolver.model_->offset_;

  // remove the current incumbent. Any incumbent is already transformed into the
  // original space and kept there
  incumbent.clear();
  pruned_treeweight = 0;
  nodequeue.clear();
  globalOrbits.reset();

  // Need to be able to set presolve reduction limit separately when
  // restarting - so that bugs in presolve restart can be investigated
  // independently (see #1553)
  //
  // However, when restarting, presolve is (naturally) applied to the
  // presolved problem, so have to control the number of _further_
  // presolve reductions
  //
  // The number of further presolve reductions must be positive,
  // otherwise the MIP solver cycles, hence
  // restart_presolve_reduction_limit cannot be zero
  //
  // Although postSolveStack.numReductions() is size_t, it makes no
  // sense to use presolve_reduction_limit when the number of
  // reductions is vast
  HighsInt num_reductions = HighsInt(postSolveStack.numReductions());
  HighsInt restart_presolve_reduction_limit =
      mipsolver.options_mip_->restart_presolve_reduction_limit;
  assert(restart_presolve_reduction_limit);
  HighsInt further_presolve_reduction_limit =
      restart_presolve_reduction_limit >= 0
          ? num_reductions + restart_presolve_reduction_limit
          : -1;
  runPresolve(further_presolve_reduction_limit);

  if (mipsolver.modelstatus_ != HighsModelStatus::kNotset) {
    // transform the objective limit to the current model
    upper_limit -= mipsolver.model_->offset_;
    optimality_limit -= mipsolver.model_->offset_;

    if (mipsolver.modelstatus_ == HighsModelStatus::kOptimal) {
      mipsolver.mipdata_->upper_bound = 0;
      mipsolver.mipdata_->transformNewIntegerFeasibleSolution(
          std::vector<double>());
    } else {
      upper_bound -= mipsolver.model_->offset_;
    }

    // lower_bound still relates to the original model, and the offset
    // is never applied, since MIP solving is complete, and
    // lower_bound is set to upper_bound, so apply the offset now, so
    // that housekeeping in updatePrimalDualIntegral is correct
    double prev_lower_bound = lower_bound - mipsolver.model_->offset_;

    lower_bound = upper_bound;

    // There must be a gap change, since it's now zero, so always call
    // updatePrimalDualIntegral (unless solving a sub-MIP)
    //
    // Surely there must be a lower bound change
    bool bound_change = lower_bound != prev_lower_bound;
    assert(bound_change);
    if (!mipsolver.submip && bound_change)
      updatePrimalDualIntegral(prev_lower_bound, lower_bound, upper_bound,
                               upper_bound);
    if (mipsolver.solution_objective_ != kHighsInf &&
        mipsolver.modelstatus_ == HighsModelStatus::kInfeasible)
      mipsolver.modelstatus_ = HighsModelStatus::kOptimal;
    return;
  }
  // Bounds are currently in the original space since presolve will have
  // changed offset_
  runSetup();

  postSolveStack.removeCutsFromModel(numCuts);

  // HighsNodeQueue oldNodeQueue;
  // std::swap(nodequeue, oldNodeQueue);

  // remove the pointer into the stack-space of this function
  if (mipsolver.rootbasis == &root_basis) mipsolver.rootbasis = nullptr;
  mipsolver.pscostinit = nullptr;
}